

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AutoGeometry.cpp
# Opt level: O1

void __thiscall
HACD::MyAutoGeometry::addBone(MyAutoGeometry *this,HaU32 bone,HaU32 *bones,HaU32 *bcount)

{
  ulong uVar1;
  long lVar2;
  
  uVar1 = (ulong)*bcount;
  if (7 < uVar1) {
    __assert_fail("bcount < 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/AutoGeometry.cpp"
                  ,0xda,
                  "void HACD::MyAutoGeometry::addBone(hacd::HaU32, hacd::HaU32 *, hacd::HaU32 &)");
  }
  if (uVar1 != 0) {
    lVar2 = 0;
    do {
      if (bones[lVar2] == bone) {
        return;
      }
      lVar2 = lVar2 + 1;
    } while (*bcount != (uint)lVar2);
  }
  bones[uVar1] = bone;
  *bcount = *bcount + 1;
  return;
}

Assistant:

void addBone(hacd::HaU32 bone,hacd::HaU32 *bones,hacd::HaU32 &bcount)
		{
			HACD_ASSERT(bcount < MAX_BONE_COUNT);
			if ( bcount < MAX_BONE_COUNT )
			{
				bool found = false;

				for (hacd::HaU32 i=0; i<bcount; i++)
				{
					if ( bones[i] == bone )
					{
						found = true;
						break;
					}
				}
				if ( !found )
				{
					bones[bcount] = bone;
					bcount++;
				}
			}
		}